

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

SlidingWindowsLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_slidingwindows
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x3ed) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3ed;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.slidingwindows_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::SlidingWindowsLayerParams>(arena);
    (this->layer_).slidingwindows_ = (SlidingWindowsLayerParams *)LVar2;
  }
  return (SlidingWindowsLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::SlidingWindowsLayerParams* NeuralNetworkLayer::_internal_mutable_slidingwindows() {
  if (!_internal_has_slidingwindows()) {
    clear_layer();
    set_has_slidingwindows();
    layer_.slidingwindows_ = CreateMaybeMessage< ::CoreML::Specification::SlidingWindowsLayerParams >(GetArenaForAllocation());
  }
  return layer_.slidingwindows_;
}